

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

GlobalVariable * __thiscall hdc::Parser::parse_global_variable(Parser *this)

{
  bool bVar1;
  Type *type;
  Expression *expression;
  GlobalVariable *this_00;
  Token name;
  
  name.lexem._M_dataplus._M_p = (pointer)&name.lexem.field_2;
  name.lexem._M_string_length = 0;
  name.lexem.field_2._M_local_buf[0] = '\0';
  expect(this,TK_VAR);
  expect(this,TK_ID);
  Token::operator=(&name,(this->matched)._M_current);
  bVar1 = match(this,TK_COLON);
  if (bVar1) {
    type = parse_type(this);
    bVar1 = match(this,TK_ASSIGNMENT);
    if (bVar1) {
      expression = parse_assignment_expression(this);
    }
    else {
      expression = (Expression *)0x0;
    }
  }
  else {
    expect(this,TK_ASSIGNMENT);
    expression = parse_assignment_expression(this);
    type = (Type *)0x0;
  }
  expect(this,TK_NEWLINE);
  this_00 = (GlobalVariable *)operator_new(0x78);
  GlobalVariable::GlobalVariable(this_00,&name,type,expression);
  std::__cxx11::string::~string((string *)&name.lexem);
  return this_00;
}

Assistant:

GlobalVariable* Parser::parse_global_variable() {
    Token name;
    Type* type = nullptr;
    Expression* expression = nullptr;

    expect(TK_VAR);
    expect(TK_ID);
    name = *matched;

    if (match(TK_COLON)) {
        type = parse_type();

        if (match(TK_ASSIGNMENT)) {
            expression = parse_expression();
        }
    } else {
        expect(TK_ASSIGNMENT);
        expression = parse_expression();
    }

    expect(TK_NEWLINE);
    return new GlobalVariable(name, type, expression);
}